

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a2.cpp
# Opt level: O3

void msd_A2(uchar **strings,size_t N)

{
  cacheblock_t *cache;
  uchar **ppuVar1;
  size_t sVar2;
  TempSpace tmp;
  TempSpace local_40;
  
  cache = (cacheblock_t *)malloc(N << 4);
  if (N == 0) {
    TempSpace::TempSpace(&local_40,strings,0);
    fill_cache(cache,0,0);
    msd_A2(cache,0,0,0,&local_40);
  }
  else {
    ppuVar1 = &cache->ptr;
    sVar2 = 0;
    do {
      *ppuVar1 = strings[sVar2];
      sVar2 = sVar2 + 1;
      ppuVar1 = ppuVar1 + 2;
    } while (N != sVar2);
    TempSpace::TempSpace(&local_40,strings,N);
    sVar2 = 0;
    fill_cache(cache,N,0);
    msd_A2(cache,N,0,0,&local_40);
    ppuVar1 = &cache->ptr;
    do {
      strings[sVar2] = *ppuVar1;
      sVar2 = sVar2 + 1;
      ppuVar1 = ppuVar1 + 2;
    } while (N != sVar2);
  }
  free(cache);
  return;
}

Assistant:

void
msd_A2(unsigned char** strings, size_t N)
{
	cacheblock_t* cache =
		static_cast<cacheblock_t*>(malloc(N*sizeof(cacheblock_t)));
	for (size_t i=0; i < N; ++i) cache[i].ptr = strings[i];
	TempSpace tmp(strings, N);
	fill_cache(cache, N, 0);
	msd_A2(cache, N, 0, 0, tmp);
	for (size_t i=0; i < N; ++i) strings[i] = cache[i].ptr;
	free(cache);
}